

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv__make_close_pending(uv_handle_t *handle)

{
  if ((handle->flags & 1) == 0) {
    __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                  ,0xe1,"void uv__make_close_pending(uv_handle_t *)");
  }
  if ((handle->flags & 2) == 0) {
    handle->next_closing = handle->loop->closing_handles;
    handle->loop->closing_handles = handle;
    return;
  }
  __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                ,0xe2,"void uv__make_close_pending(uv_handle_t *)");
}

Assistant:

void uv__make_close_pending(uv_handle_t* handle) {
  assert(handle->flags & UV_HANDLE_CLOSING);
  assert(!(handle->flags & UV_HANDLE_CLOSED));
  handle->next_closing = handle->loop->closing_handles;
  handle->loop->closing_handles = handle;
}